

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall kernel::BlockTreeDB::ReadFlag(BlockTreeDB *this,string *name,bool *fValue)

{
  bool bVar1;
  long in_FS_OFFSET;
  uint8_t ch;
  uchar local_51;
  undefined1 local_50 [40];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  pair<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((pair<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50,"F\x01",name);
  bVar1 = CDBWrapper::Read<std::pair<unsigned_char,std::__cxx11::string>,unsigned_char>
                    (&this->super_CDBWrapper,
                     (pair<unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_50,&local_51);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  if (bVar1) {
    *fValue = local_51 == '1';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockTreeDB::ReadFlag(const std::string& name, bool& fValue)
{
    uint8_t ch;
    if (!Read(std::make_pair(DB_FLAG, name), ch)) {
        return false;
    }
    fValue = ch == uint8_t{'1'};
    return true;
}